

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::PlanarMapping2D::ToString_abi_cxx11_(string *__return_storage_ptr__,PlanarMapping2D *this)

{
  float *unaff_RBX;
  
  StringPrintf<pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ PlanarMapping2D vs: %s vt: %s ds: %f dt: %f]",
             (char *)this,&this->vt,(Vector3<float> *)&this->ds,&this->dt,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string PlanarMapping2D::ToString() const {
    return StringPrintf("[ PlanarMapping2D vs: %s vt: %s ds: %f dt: %f]", vs, vt, ds, dt);
}